

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_key_helpers.hpp
# Opt level: O0

void duckdb::AggregateSortKeyHelpers::
     UnaryUpdate<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::ModeFallbackFunction<duckdb::ModeString>,(duckdb::OrderType)2,true>
               (Vector *inputs,AggregateInputData *input_data,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  bool bVar1;
  Vector *this;
  idx_t iVar2;
  ulong in_R8;
  ModeState<duckdb::string_t,_duckdb::ModeString> *state;
  idx_t key_idx;
  idx_t idx;
  idx_t sidx;
  idx_t i;
  ModeState<duckdb::string_t,_duckdb::ModeString> **states;
  string_t *key_data;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat kdata;
  UnifiedVectorFormat idata;
  OrderModifiers modifiers;
  Vector sort_key;
  Vector *input;
  TemplatedValidityMask<unsigned_long> *this_00;
  UnifiedVectorFormat *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  LogicalType *in_stack_fffffffffffffe40;
  idx_t in_stack_fffffffffffffe50;
  ulong idx_00;
  LogicalType *in_stack_fffffffffffffe58;
  Vector *pVVar3;
  Vector *in_stack_fffffffffffffe60;
  SelectionVector *local_198;
  Vector *in_stack_fffffffffffffe78;
  element_type *in_stack_fffffffffffffe80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe88;
  OrderModifiers in_stack_fffffffffffffe96;
  SelectionVector *local_150;
  UnifiedVectorFormat *in_stack_fffffffffffffee0;
  element_type *in_stack_fffffffffffffee8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffef0;
  SelectionVector *local_108;
  OrderModifiers local_be [7];
  TemplatedValidityMask<unsigned_long> local_b0 [4];
  ulong local_28;
  
  this_00 = local_b0;
  local_28 = in_R8;
  LogicalType::LogicalType
            (in_stack_fffffffffffffe40,(LogicalTypeId)((ulong)in_stack_fffffffffffffe38 >> 0x38));
  Vector::Vector(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  LogicalType::~LogicalType((LogicalType *)0x1cca74c);
  OrderModifiers::OrderModifiers(local_be,ASCENDING,NULLS_LAST);
  CreateSortKeyHelpers::CreateSortKey
            ((Vector *)in_stack_fffffffffffffe88._M_pi,(idx_t)in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe96,in_stack_fffffffffffffe78);
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffe30);
  Vector::ToUnifiedFormat
            ((Vector *)in_stack_fffffffffffffef0._M_pi,(idx_t)in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffe30);
  Vector::ToUnifiedFormat
            ((Vector *)in_stack_fffffffffffffef0._M_pi,(idx_t)in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffe30);
  Vector::ToUnifiedFormat
            ((Vector *)in_stack_fffffffffffffef0._M_pi,(idx_t)in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
  UnifiedVectorFormat::GetData<duckdb::string_t>((UnifiedVectorFormat *)&local_150);
  this = (Vector *)
         UnifiedVectorFormat::GetData<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>*>
                   ((UnifiedVectorFormat *)&local_198);
  pVVar3 = this;
  for (idx_00 = 0; idx_00 < local_28; idx_00 = idx_00 + 1) {
    iVar2 = SelectionVector::get_index(local_198,idx_00);
    SelectionVector::get_index(local_108,idx_00);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,(idx_t)this);
    if (bVar1) {
      SelectionVector::get_index(local_150,idx_00);
      BaseModeFunction<duckdb::ModeString>::
      Execute<duckdb::string_t,duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::ModeFallbackFunction<duckdb::ModeString>>
                (*(ModeState<duckdb::string_t,_duckdb::ModeString> **)
                  ((long)&pVVar3->vector_type + iVar2 * 8),(string_t *)this_00,
                 (AggregateInputData *)this);
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)this);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)this);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)this);
  Vector::~Vector(this);
  return;
}

Assistant:

static void UnaryUpdate(Vector inputs[], AggregateInputData &input_data, idx_t input_count, Vector &state_vector,
	                        idx_t count) {
		D_ASSERT(input_count == 1);
		auto &input = inputs[0];

		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		CreateSortKeyHelpers::CreateSortKey(input, count, modifiers, sort_key);

		UnifiedVectorFormat idata;
		if (IGNORE_NULLS) {
			input.ToUnifiedFormat(count, idata);
		}

		UnifiedVectorFormat kdata;
		sort_key.ToUnifiedFormat(count, kdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		auto key_data = UnifiedVectorFormat::GetData<string_t>(kdata);
		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto sidx = sdata.sel->get_index(i);
			if (IGNORE_NULLS) {
				auto idx = idata.sel->get_index(i);
				if (!idata.validity.RowIsValid(idx)) {
					continue;
				}
			}
			const auto key_idx = kdata.sel->get_index(i);
			auto &state = *states[sidx];
			OP::template Execute<string_t, STATE, OP>(state, key_data[key_idx], input_data);
		}
	}